

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

int dictExpand(dict *ht,unsigned_long size)

{
  ulong uVar1;
  dictType *pdVar2;
  void *pvVar3;
  dictEntry *pdVar4;
  dictEntry *pdVar5;
  int iVar6;
  uint uVar7;
  dictEntry **ppdVar8;
  ulong uVar9;
  ulong __nmemb;
  
  if (size < 0x7fffffffffffffff) {
    uVar1 = 4;
    do {
      __nmemb = uVar1;
      uVar1 = __nmemb * 2;
    } while (__nmemb < size);
  }
  else {
    __nmemb = 0x7fffffffffffffff;
  }
  uVar1 = ht->used;
  iVar6 = 1;
  if (uVar1 <= size) {
    pdVar2 = ht->type;
    pvVar3 = ht->privdata;
    ppdVar8 = (dictEntry **)calloc(__nmemb,8);
    if (ht->size != 0) {
      uVar9 = 0;
      do {
        if (ht->used == 0) break;
        pdVar5 = ht->table[uVar9];
        while (pdVar5 != (dictEntry *)0x0) {
          pdVar4 = pdVar5->next;
          uVar7 = (*ht->type->hashFunction)(pdVar5->key);
          uVar7 = uVar7 & (uint)(__nmemb - 1);
          pdVar5->next = ppdVar8[uVar7];
          ppdVar8[uVar7] = pdVar5;
          ht->used = ht->used - 1;
          pdVar5 = pdVar4;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < ht->size);
    }
    if (ht->used != 0) {
      __assert_fail("ht->used == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/dict.c"
                    ,0x7e,"int dictExpand(dict *, unsigned long)");
    }
    free(ht->table);
    ht->table = ppdVar8;
    ht->type = pdVar2;
    ht->size = __nmemb;
    ht->sizemask = __nmemb - 1;
    ht->used = uVar1;
    ht->privdata = pvVar3;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int dictExpand(dict *ht, unsigned long size) {
    dict n; /* the new hashtable */
    unsigned long realsize = _dictNextPower(size), i;

    /* the size is invalid if it is smaller than the number of
     * elements already inside the hashtable */
    if (ht->used > size)
        return DICT_ERR;

    _dictInit(&n, ht->type, ht->privdata);
    n.size = realsize;
    n.sizemask = realsize-1;
    n.table = calloc(realsize,sizeof(dictEntry*));

    /* Copy all the elements from the old to the new table:
     * note that if the old hash table is empty ht->size is zero,
     * so dictExpand just creates an hash table. */
    n.used = ht->used;
    for (i = 0; i < ht->size && ht->used > 0; i++) {
        dictEntry *he, *nextHe;

        if (ht->table[i] == NULL) continue;

        /* For each hash entry on this slot... */
        he = ht->table[i];
        while(he) {
            unsigned int h;

            nextHe = he->next;
            /* Get the new element index */
            h = dictHashKey(ht, he->key) & n.sizemask;
            he->next = n.table[h];
            n.table[h] = he;
            ht->used--;
            /* Pass to the next element */
            he = nextHe;
        }
    }
    assert(ht->used == 0);
    free(ht->table);

    /* Remap the new hashtable in the old */
    *ht = n;
    return DICT_OK;
}